

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_PolyEdgeHistoryValue::WriteHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(archive,(this->m_value).m_count);
    if (bVar1) {
      uVar5 = (ulong)(this->m_value).m_count;
      if ((long)uVar5 < 1) {
        bVar1 = true;
      }
      else {
        uVar3 = 1;
        lVar4 = 0;
        do {
          bVar1 = ON_PolyEdgeHistory::Write
                            ((ON_PolyEdgeHistory *)
                             (((this->m_value).m_a)->m_reserved + lVar4 + -0x34),archive);
          if (uVar5 <= uVar3) break;
          lVar4 = lVar4 + 0x78;
          uVar3 = uVar3 + 1;
        } while (bVar1);
      }
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_PolyEdgeHistoryValue::WriteHelper(ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = archive.WriteInt(m_value.Count());
    if (!rc) break;
    
    int i, count = m_value.Count();
    for( i = 0; i < count && rc; i++ )
    {
      rc = m_value[i].Write(archive);
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}